

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

bool __thiscall cmFindPackageCommand::HandlePackageMode(cmFindPackageCommand *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pCVar3;
  pointer pbVar4;
  size_type sVar5;
  cmFindPackageCommand *pcVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  char *pcVar10;
  cmMakefile *pcVar11;
  ostream *poVar12;
  byte bVar13;
  ulong uVar14;
  long lVar15;
  string consideredVersionsVar;
  string foundVar;
  string consideredConfigFiles;
  string notFoundMessage;
  string notFoundMessageVar;
  string consideredVersions;
  string upperFound;
  string upperDir;
  string fileVar;
  string consideredConfigsVar;
  string local_498;
  cmFindPackageCommand *local_478;
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  *local_470;
  string local_468;
  string local_448;
  uint local_424;
  char *local_420;
  char *local_418;
  char local_410;
  undefined7 uStack_40f;
  string local_400;
  char *local_3e0;
  undefined8 local_3d8;
  char local_3d0;
  undefined7 uStack_3cf;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_470 = &this->ConsideredConfigs;
  std::
  vector<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  ::_M_erase_at_end(local_470,
                    (this->ConsideredConfigs).
                    super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  cmsys::SystemTools::UpperCase(&local_340,&this->Name);
  cmsys::SystemTools::UpperCase(&local_360,&this->Name);
  std::__cxx11::string::append((char *)&local_340);
  std::__cxx11::string::append((char *)&local_360);
  pcVar11 = (cmMakefile *)&this->Variable;
  pcVar10 = cmMakefile::GetDefinition
                      ((this->super_cmFindCommon).super_cmCommand.Makefile,(string *)pcVar11);
  local_478 = this;
  if (this->UseConfigFiles == true) {
    bVar7 = cmSystemTools::IsOff(pcVar10);
    if (bVar7) {
      bVar7 = false;
    }
    else {
      std::__cxx11::string::string((string *)local_320,pcVar10,(allocator *)local_1a8);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_320);
      bVar7 = cmsys::SystemTools::FileIsFullPath((char *)local_320._0_8_);
      if (!bVar7) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,"/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_320);
        std::__cxx11::string::operator=((string *)local_320,(string *)local_1a8);
        pcVar6 = local_478;
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
        }
        pcVar10 = cmMakefile::GetCurrentSourceDirectory
                            ((pcVar6->super_cmFindCommon).super_cmCommand.Makefile);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,pcVar10,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_320);
        std::__cxx11::string::operator=((string *)local_320,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
        }
      }
      local_1a8._8_8_ = 0;
      local_1a8[0x10] = '\0';
      local_1a8._0_8_ = local_1a8 + 0x10;
      bVar7 = FindConfigFile(local_478,(string *)local_320,(string *)local_1a8);
      if (bVar7) {
        std::__cxx11::string::_M_assign((string *)&local_478->FileFound);
      }
      pcVar10 = cmMakefile::GetDefinition
                          ((local_478->super_cmFindCommon).super_cmCommand.Makefile,
                           (string *)pcVar11);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
      this = local_478;
      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
      }
    }
    bVar8 = cmSystemTools::IsOff(pcVar10);
    if ((bVar8) || (bVar7 == false)) {
      bVar7 = FindConfig(this);
    }
    if ((bVar7 != false) && ((this->FileFound)._M_string_length == 0)) {
      pcVar11 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      local_320._0_8_ = local_320 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_320,"fileFound is true but FileFound is empty!","");
      cmMakefile::IssueMessage(pcVar11,INTERNAL_ERROR,(string *)local_320);
      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
      }
      bVar7 = false;
      this = local_478;
    }
  }
  else {
    bVar7 = false;
  }
  local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
  pcVar2 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_468,pcVar2,pcVar2 + (this->Name)._M_string_length);
  std::__cxx11::string::append((char *)&local_468);
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  pcVar2 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,pcVar2,pcVar2 + (this->Name)._M_string_length);
  std::__cxx11::string::append((char *)&local_400);
  local_420 = &local_410;
  local_418 = (char *)0x0;
  local_410 = '\0';
  if (bVar7 == false) {
LAB_003049fc:
    if ((this->Quiet != true) || (this->Required == true)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      if (bVar7 == false) {
        if ((this->ConsideredConfigs).
            super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->ConsideredConfigs).
            super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          paVar1 = &local_498.field_2;
          local_498._M_string_length = 0;
          local_498.field_2._M_local_buf[0] = '\0';
          local_498._M_dataplus._M_p = (pointer)paVar1;
          if ((this->Version)._M_string_length != 0) {
            std::__cxx11::string::_M_replace((ulong)&local_498,0,(char *)0x0,0x4bd492);
            std::__cxx11::string::_M_append
                      ((char *)&local_498,(ulong)(this->Version)._M_dataplus._M_p);
            std::__cxx11::string::append((char *)&local_498);
          }
          if (this->UseConfigFiles == true) {
            if (this->UseFindModules == true) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_320,"By not providing \"Find",0x16);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                                   (this->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,
                         ".cmake\" in CMAKE_MODULE_PATH this project has asked CMake to find a package configuration file provided by \""
                         ,0x6c);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(this->Name)._M_dataplus._M_p,
                                   (this->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,"\", but CMake did not find one.\n",0x1f);
            }
            if ((long)(this->Configs).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->Configs).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start == 0x20) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_320,"Could not find a package configuration file named \""
                         ,0x33);
              pbVar4 = (this->Configs).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_320,(pbVar4->_M_dataplus)._M_p,
                                   pbVar4->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,"\" provided by package \"",0x17);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,(this->Name)._M_dataplus._M_p,
                                   (this->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\"",1);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,local_498._M_dataplus._M_p,local_498._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,".\n",2);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_320,
                         "Could not find a package configuration file provided by \"",0x39);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                                   (this->Name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\"",1);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,local_498._M_dataplus._M_p,local_498._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12," with any of the following names:\n",0x22);
              local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"  ","");
              local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"");
              local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"\n","");
              cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        (&local_448,&local_3a0,&this->Configs,&local_3c0,&local_380);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,local_448._M_dataplus._M_p,local_448._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_448._M_dataplus._M_p != &local_448.field_2) {
                operator_delete(local_448._M_dataplus._M_p,
                                CONCAT71(local_448.field_2._M_allocated_capacity._1_7_,
                                         local_448.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_380._M_dataplus._M_p != &local_380.field_2) {
                operator_delete(local_380._M_dataplus._M_p,
                                local_380.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
                operator_delete(local_3c0._M_dataplus._M_p,
                                local_3c0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                operator_delete(local_3a0._M_dataplus._M_p,
                                local_3a0.field_2._M_allocated_capacity + 1);
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,"Add the installation prefix of \"",0x20);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                                 (this->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"\" to CMAKE_PREFIX_PATH or set \"",0x1f);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(this->Variable)._M_dataplus._M_p,
                                 (this->Variable)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"\" to a directory containing one of the above files. If \"",0x38);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length
                                );
            lVar15 = 0x50;
            pcVar10 = 
            "\" provides a separate development package or SDK, be sure it has been installed.";
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"No \"Find",8);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                                 (this->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,".cmake\" found in ",0x11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"CMAKE_MODULE_PATH.",0x12);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Find",4);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(this->Name)._M_dataplus._M_p,
                                 (this->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,
                       ".cmake must either be part of this project itself, in this case adjust CMAKE_MODULE_PATH so that it points to the correct location inside its source tree.\nOr it must be installed by a package which has already been found via find_package().  In this case make sure that package has indeed been found and adjust CMAKE_MODULE_PATH to contain the location where that package has installed Find"
                       ,0x186);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length
                                );
            lVar15 = 0xc9;
            pcVar10 = 
            ".cmake.  This must be a location provided by that package.  This error in general means that the buildsystem of this project is relying on a Find-module without ensuring that it is actually available.\n"
            ;
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar10,lVar15);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != paVar1) {
            operator_delete(local_498._M_dataplus._M_p,
                            CONCAT71(local_498.field_2._M_allocated_capacity._1_7_,
                                     local_498.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,"Could not find a configuration file for package \"",0x31)
          ;
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_320,(this->Name)._M_dataplus._M_p,
                               (this->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" that ",7);
          pcVar10 = "is compatible with";
          if ((ulong)this->VersionExact != 0) {
            pcVar10 = "exactly matches";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,pcVar10,((ulong)this->VersionExact ^ 1) * 3 + 0xf);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," requested version \"",0x14);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,(this->Version)._M_dataplus._M_p,
                               (this->Version)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\".\n",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"The following configuration files were considered but not accepted:\n"
                     ,0x44);
          if ((this->ConsideredConfigs).
              super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (this->ConsideredConfigs).
              super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar15 = 0;
            uVar14 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"  ",2);
              pCVar3 = (local_470->
                       super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_320,
                                   *(char **)((long)&(pCVar3->filename)._M_dataplus._M_p + lVar15),
                                   *(long *)((long)&(pCVar3->filename)._M_string_length + lVar15));
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,", version: ",0xb);
              pCVar3 = (local_470->
                       super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar12,*(char **)((long)&(pCVar3->version)._M_dataplus._M_p +
                                                     lVar15),
                                   *(long *)((long)&(pCVar3->version)._M_string_length + lVar15));
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
              uVar14 = uVar14 + 1;
              lVar15 = lVar15 + 0x40;
            } while (uVar14 < (ulong)((long)(this->ConsideredConfigs).
                                            super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->ConsideredConfigs).
                                            super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 6));
          }
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,"Found package configuration file:\n  ",0x24);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_320,(this->FileFound)._M_dataplus._M_p,
                             (this->FileFound)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\nbut it set ",0xc);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,local_468._M_dataplus._M_p,local_468._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," to FALSE so package \"",0x16);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,(this->Name)._M_dataplus._M_p,(this->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12,"\" is considered to be NOT FOUND.",0x20);
        if (local_418 != (char *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320," Reason given by package: \n",0x1b);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_320,local_420,(long)local_418);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
        }
      }
      pcVar11 = (this->super_cmFindCommon).super_cmCommand.Makefile;
      bVar7 = this->Required;
      std::__cxx11::stringbuf::str();
      bVar13 = bVar7 ^ 1;
      cmMakefile::IssueMessage(pcVar11,(uint)bVar13 + (uint)bVar13 * 2 + FATAL_ERROR,&local_498);
      paVar1 = &local_498.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != paVar1) {
        operator_delete(local_498._M_dataplus._M_p,
                        CONCAT71(local_498.field_2._M_allocated_capacity._1_7_,
                                 local_498.field_2._M_local_buf[0]) + 1);
      }
      if (this->Required == true) {
        cmSystemTools::s_FatalErrorOccured = true;
      }
      std::__cxx11::stringbuf::str();
      sVar5 = local_498._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != paVar1) {
        operator_delete(local_498._M_dataplus._M_p,
                        CONCAT71(local_498.field_2._M_allocated_capacity._1_7_,
                                 local_498.field_2._M_local_buf[0]) + 1);
      }
      if (sVar5 != 0) {
        pcVar11 = (this->super_cmFindCommon).super_cmCommand.Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar11,AUTHOR_WARNING,&local_498);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_498._M_dataplus._M_p != paVar1) {
          operator_delete(local_498._M_dataplus._M_p,
                          CONCAT71(local_498.field_2._M_allocated_capacity._1_7_,
                                   local_498.field_2._M_local_buf[0]) + 1);
        }
      }
      pcVar11 = (cmMakefile *)&std::__cxx11::ostringstream::VTT;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
      std::ios_base::~ios_base(local_2b0);
    }
    uVar14 = CONCAT71((int7)((ulong)pcVar11 >> 8),1);
  }
  else {
    bVar8 = cmMakefile::IsDefinitionSet
                      ((this->super_cmFindCommon).super_cmCommand.Makefile,&local_468);
    if ((bVar8) &&
       (bVar8 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,&local_468),
       !bVar8)) {
      cmMakefile::RemoveDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_468);
    }
    cmMakefile::RemoveDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_400);
    StoreVersionFound(this);
    bVar8 = ReadListFile(this,(this->FileFound)._M_dataplus._M_p,DoPolicyScope);
    if (bVar8) {
      bVar8 = cmMakefile::IsDefinitionSet
                        ((this->super_cmFindCommon).super_cmCommand.Makefile,&local_468);
      pcVar10 = "1";
      uVar14 = CONCAT71((int7)((ulong)pcVar11 >> 8),1);
      if (!bVar8) {
        bVar8 = true;
        goto LAB_003052e5;
      }
      bVar9 = cmMakefile::IsOn((this->super_cmFindCommon).super_cmCommand.Makefile,&local_468);
      bVar8 = true;
      if (bVar9) goto LAB_003052e5;
      pcVar11 = (cmMakefile *)
                cmMakefile::GetSafeDefinition
                          ((this->super_cmFindCommon).super_cmCommand.Makefile,&local_400);
      pcVar10 = local_418;
      strlen((char *)pcVar11);
      std::__cxx11::string::_M_replace((ulong)&local_420,0,pcVar10,(ulong)pcVar11);
      goto LAB_003049fc;
    }
    uVar14 = 0;
  }
  pcVar10 = "0";
  bVar8 = false;
LAB_003052e5:
  cmMakefile::AddDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_468,pcVar10);
  local_320._0_8_ = local_320 + 0x10;
  pcVar2 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_320,pcVar2,pcVar2 + (this->Name)._M_string_length);
  std::__cxx11::string::append(local_320);
  pcVar11 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  if (bVar8) {
    cmMakefile::AddDefinition(pcVar11,(string *)local_320,(this->FileFound)._M_dataplus._M_p);
  }
  else {
    cmMakefile::RemoveDefinition(pcVar11,(string *)local_320);
  }
  local_1a8._0_8_ = local_1a8 + 0x10;
  pcVar2 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,pcVar2,pcVar2 + (this->Name)._M_string_length);
  std::__cxx11::string::append(local_1a8);
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  pcVar2 = (this->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_498,pcVar2,pcVar2 + (this->Name)._M_string_length);
  std::__cxx11::string::append((char *)&local_498);
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  local_448._M_string_length = 0;
  local_448.field_2._M_local_buf[0] = '\0';
  local_3e0 = &local_3d0;
  local_3d8 = 0;
  local_3d0 = '\0';
  if ((this->ConsideredConfigs).
      super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->ConsideredConfigs).
      super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_424 = (uint)uVar14;
    lVar15 = 0;
    uVar14 = 0;
    do {
      std::__cxx11::string::append((char *)&local_448);
      std::__cxx11::string::append((char *)&local_3e0);
      std::__cxx11::string::_M_append
                ((char *)&local_448,
                 *(ulong *)((long)&(((local_470->
                                     super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->filename).
                                   _M_dataplus._M_p + lVar15));
      std::__cxx11::string::_M_append
                ((char *)&local_3e0,
                 *(ulong *)((long)&(((local_470->
                                     super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->version).
                                   _M_dataplus._M_p + lVar15));
      uVar14 = uVar14 + 1;
      lVar15 = lVar15 + 0x40;
    } while (uVar14 < (ulong)((long)(local_478->ConsideredConfigs).
                                    super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_478->ConsideredConfigs).
                                    super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 6));
    uVar14 = (ulong)local_424;
    this = local_478;
  }
  cmMakefile::AddDefinition
            ((this->super_cmFindCommon).super_cmCommand.Makefile,(string *)local_1a8,
             local_448._M_dataplus._M_p);
  cmMakefile::AddDefinition
            ((this->super_cmFindCommon).super_cmCommand.Makefile,&local_498,local_3e0);
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0,CONCAT71(uStack_3cf,local_3d0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,
                    CONCAT71(local_448.field_2._M_allocated_capacity._1_7_,
                             local_448.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,
                    CONCAT71(local_498.field_2._M_allocated_capacity._1_7_,
                             local_498.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
  }
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420,CONCAT71(uStack_40f,local_410) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._M_dataplus._M_p != &local_468.field_2) {
    operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  return (bool)(char)uVar14;
}

Assistant:

bool cmFindPackageCommand::HandlePackageMode()
{
  this->ConsideredConfigs.clear();

  // Support old capitalization behavior.
  std::string upperDir = cmSystemTools::UpperCase(this->Name);
  std::string upperFound = cmSystemTools::UpperCase(this->Name);
  upperDir += "_DIR";
  upperFound += "_FOUND";

  // Try to find the config file.
  const char* def = this->Makefile->GetDefinition(this->Variable);

  // Try to load the config file if the directory is known
  bool fileFound = false;
  if (this->UseConfigFiles)
    {
    if(!cmSystemTools::IsOff(def))
      {
      // Get the directory from the variable value.
      std::string dir = def;
      cmSystemTools::ConvertToUnixSlashes(dir);

      // Treat relative paths with respect to the current source dir.
      if(!cmSystemTools::FileIsFullPath(dir.c_str()))
        {
        dir = "/" + dir;
        dir = this->Makefile->GetCurrentSourceDirectory() + dir;
        }
      // The file location was cached.  Look for the correct file.
      std::string file;
      if (this->FindConfigFile(dir, file))
        {
        this->FileFound = file;
        fileFound = true;
        }
      def = this->Makefile->GetDefinition(this->Variable);
      }

    // Search for the config file if it is not already found.
    if(cmSystemTools::IsOff(def) || !fileFound)
      {
      fileFound = this->FindConfig();
      }

    // Sanity check.
    if(fileFound && this->FileFound.empty())
      {
      this->Makefile->IssueMessage(
        cmake::INTERNAL_ERROR, "fileFound is true but FileFound is empty!");
      fileFound = false;
      }
    }

  std::string foundVar = this->Name;
  foundVar += "_FOUND";
  std::string notFoundMessageVar = this->Name;
  notFoundMessageVar += "_NOT_FOUND_MESSAGE";
  std::string notFoundMessage;

  // If the directory for the config file was found, try to read the file.
  bool result = true;
  bool found = false;
  bool configFileSetFOUNDFalse = false;

  if(fileFound)
    {
    if ((this->Makefile->IsDefinitionSet(foundVar))
      && (this->Makefile->IsOn(foundVar) == false))
      {
      // by removing Foo_FOUND here if it is FALSE, we don't really change
      // the situation for the Config file which is about to be included,
      // but we make it possible to detect later on whether the Config file
      // has set Foo_FOUND to FALSE itself:
      this->Makefile->RemoveDefinition(foundVar);
      }
    this->Makefile->RemoveDefinition(notFoundMessageVar);

    // Set the version variables before loading the config file.
    // It may override them.
    this->StoreVersionFound();

    // Parse the configuration file.
    if(this->ReadListFile(this->FileFound.c_str(), DoPolicyScope))
      {
      // The package has been found.
      found = true;

      // Check whether the Config file has set Foo_FOUND to FALSE:
      if ((this->Makefile->IsDefinitionSet(foundVar))
           && (this->Makefile->IsOn(foundVar) == false))
        {
        // we get here if the Config file has set Foo_FOUND actively to FALSE
        found = false;
        configFileSetFOUNDFalse = true;
        notFoundMessage = this->Makefile->GetSafeDefinition(
                                                   notFoundMessageVar);
        }
      }
    else
      {
      // The configuration file is invalid.
      result = false;
      }
    }

  if (result && !found && (!this->Quiet || this->Required))
    {
    // The variable is not set.
    std::ostringstream e;
    std::ostringstream aw;
    if (configFileSetFOUNDFalse)
      {
      e << "Found package configuration file:\n"
        "  " << this->FileFound << "\n"
        "but it set " << foundVar << " to FALSE so package \"" <<
        this->Name << "\" is considered to be NOT FOUND.";
      if (!notFoundMessage.empty())
        {
        e << " Reason given by package: \n" << notFoundMessage << "\n";
        }
      }
    // If there are files in ConsideredConfigs, it means that FooConfig.cmake
    // have been found, but they didn't have appropriate versions.
    else if (!this->ConsideredConfigs.empty())
      {
      e << "Could not find a configuration file for package \""
        << this->Name << "\" that "
        << (this->VersionExact? "exactly matches" : "is compatible with")
        << " requested version \"" << this->Version << "\".\n"
        << "The following configuration files were considered but not "
           "accepted:\n";
      for(std::vector<ConfigFileInfo>::size_type i=0;
          i<this->ConsideredConfigs.size(); i++)
        {
        e << "  " << this->ConsideredConfigs[i].filename
          << ", version: " << this->ConsideredConfigs[i].version << "\n";
        }
      }
    else
      {
      std::string requestedVersionString;
      if(!this->Version.empty())
        {
        requestedVersionString = " (requested version ";
        requestedVersionString += this->Version;
        requestedVersionString += ")";
        }

      if (this->UseConfigFiles)
        {
        if(this->UseFindModules)
          {
          e << "By not providing \"Find" << this->Name << ".cmake\" in "
               "CMAKE_MODULE_PATH this project has asked CMake to find a "
               "package configuration file provided by \""<<this->Name<< "\", "
               "but CMake did not find one.\n";
          }

        if(this->Configs.size() == 1)
          {
          e << "Could not find a package configuration file named \""
            << this->Configs[0] << "\" provided by package \""
            << this->Name << "\"" << requestedVersionString <<".\n";
          }
        else
          {
          e << "Could not find a package configuration file provided by \""
            << this->Name << "\"" << requestedVersionString
            << " with any of the following names:\n"
            << cmWrap("  ", this->Configs, "", "\n") << "\n";
          }

        e << "Add the installation prefix of \"" << this->Name << "\" to "
          "CMAKE_PREFIX_PATH or set \"" << this->Variable << "\" to a "
          "directory containing one of the above files. "
          "If \"" << this->Name << "\" provides a separate development "
          "package or SDK, be sure it has been installed.";
        }
      else // if(!this->UseFindModules && !this->UseConfigFiles)
        {
        e << "No \"Find" << this->Name << ".cmake\" found in "
          << "CMAKE_MODULE_PATH.";

        aw<< "Find"<< this->Name <<".cmake must either be part of this "
             "project itself, in this case adjust CMAKE_MODULE_PATH so that "
             "it points to the correct location inside its source tree.\n"
             "Or it must be installed by a package which has already been "
             "found via find_package().  In this case make sure that "
             "package has indeed been found and adjust CMAKE_MODULE_PATH to "
             "contain the location where that package has installed "
             "Find" << this->Name << ".cmake.  This must be a location "
             "provided by that package.  This error in general means that "
             "the buildsystem of this project is relying on a Find-module "
             "without ensuring that it is actually available.\n";
        }
      }


    this->Makefile->IssueMessage(
      this->Required? cmake::FATAL_ERROR : cmake::WARNING, e.str());
    if (this->Required)
      {
      cmSystemTools::SetFatalErrorOccured();
      }

    if (!aw.str().empty())
      {
      this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,aw.str());
      }
    }

  // Set a variable marking whether the package was found.
  this->Makefile->AddDefinition(foundVar, found? "1":"0");

  // Set a variable naming the configuration file that was found.
  std::string fileVar = this->Name;
  fileVar += "_CONFIG";
  if(found)
    {
    this->Makefile->AddDefinition(fileVar, this->FileFound.c_str());
    }
  else
    {
    this->Makefile->RemoveDefinition(fileVar);
    }

  std::string consideredConfigsVar = this->Name;
  consideredConfigsVar += "_CONSIDERED_CONFIGS";
  std::string consideredVersionsVar = this->Name;
  consideredVersionsVar += "_CONSIDERED_VERSIONS";

  std::string consideredConfigFiles;
  std::string consideredVersions;

  const char* sep = "";
  for(std::vector<ConfigFileInfo>::size_type i=0;
      i<this->ConsideredConfigs.size(); i++)
    {
    consideredConfigFiles += sep;
    consideredVersions += sep;
    consideredConfigFiles += this->ConsideredConfigs[i].filename;
    consideredVersions += this->ConsideredConfigs[i].version;
    sep = ";";
    }

  this->Makefile->AddDefinition(consideredConfigsVar,
                                consideredConfigFiles.c_str());

  this->Makefile->AddDefinition(consideredVersionsVar,
                                consideredVersions.c_str());

  return result;
}